

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

void __thiscall TPZString::Append(TPZString *this,char TailIncrement)

{
  size_t sVar1;
  int iVar2;
  undefined1 in_SIL;
  TPZString *in_RDI;
  int len;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4);
  sVar1 = Length(in_RDI);
  iVar2 = (int)sVar1;
  if ((in_RDI->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fNElements
      < (long)(iVar2 + 2)) {
    TPZStack<char,_10>::Push
              ((TPZStack<char,_10> *)CONCAT44(uVar3,iVar2),(char)((ulong)in_RDI >> 0x38));
  }
  else {
    (in_RDI->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore
    [iVar2 + 1] = '\0';
  }
  (in_RDI->super_TPZStack<char,_10>).super_TPZManVector<char,_10>.super_TPZVec<char>.fStore[iVar2] =
       (char)((uint)uVar3 >> 0x18);
  return;
}

Assistant:

void TPZString::Append(const char TailIncrement)
{
	int len = Length();
	// if the allocated memory is less than the length +1 (null char)
	// +1 (new char), reallocates it
	if (fNElements < len + 2)
	{
		Push('\0');
	}
	else
	{
		fStore[len + 1] = '\0';
	}
	
	fStore[len] = TailIncrement;
}